

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O0

BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::operator()
          (BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg)

{
  ostream *poVar1;
  BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *nrSolutions;
  long in_RDI;
  BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *bgsolver;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *in_stack_ffffffffffffffd8;
  BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *in_stack_ffffffffffffffe0
  ;
  
  if (1 < *(int *)(in_RDI + 0x10)) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts="
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1,", verbose=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x10));
    poVar1 = std::operator<<(poVar1,", nrSols=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x18));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  nrSolutions = (BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *)
                operator_new(0x128);
  BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG>::
  BGIP_SolverAlternatingMaximization
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(uint)((ulong)in_RDI >> 0x20),
             (int)in_RDI,(size_t)nrSolutions);
  (**(code **)(*(long *)&(nrSolutions->
                         super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>
                         ).super_BGIP_IncrementalSolverInterface + 0x30))
            (*(undefined8 *)(in_RDI + 0x20));
  return nrSolutions;
}

Assistant:

BGIP_SolverAlternatingMaximization<JP>* operator()
        (const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg) const
        {
            if(_m_verbose >= 2)
            {
                std::cout << "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts=" << _m_nrRestarts<< ", verbose=" << _m_verbose << ", nrSols="<<_m_nrSolutions << std::endl;
            }
            BGIP_SolverAlternatingMaximization<JP>* bgsolver=
                new BGIP_SolverAlternatingMaximization<JP>(
                    bg,
                    _m_nrRestarts,
                    _m_verbose,
                    _m_nrSolutions);
            bgsolver->SetDeadline(_m_deadlineInSeconds);
            return(bgsolver);
        }